

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  uint32_t *out;
  uchar *puVar1;
  int iVar2;
  libssh2_nonblocking_states lVar3;
  int iVar4;
  uint32_t uVar5;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar6;
  LIBSSH2_SFTP *sftp;
  ssize_t sVar7;
  size_t sVar8;
  char *pcVar10;
  uchar *buf_00;
  LIBSSH2_SFTP **ppLVar11;
  uchar *data;
  LIBSSH2_SFTP **local_88;
  size_t local_80;
  size_t data_len;
  uchar *local_70;
  string_buf buf;
  size_t extname_len;
  uchar *extdata;
  uchar *extname;
  long lVar9;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 8) != 0) {
      start_time = time((time_t *)0x0);
      ppLVar11 = &session->sftpInit_sftp;
      buf_00 = session->sftpInit_buffer;
LAB_00121ee8:
      iVar4 = -6;
      data_len = 0;
      lVar3 = session->sftpInit_state;
      sftp = session->sftpInit_sftp;
      switch(lVar3) {
      case libssh2_NB_state_idle:
        goto switchD_00121f13_caseD_0;
      default:
        goto switchD_00121f13_caseD_1;
      case libssh2_NB_state_created:
        goto switchD_00121f13_caseD_2;
      case libssh2_NB_state_sent:
        pLVar6 = session->sftpInit_channel;
        goto LAB_00121f73;
      case libssh2_NB_state_sent1:
        goto switchD_00121f13_caseD_4;
      case libssh2_NB_state_sent2:
        sVar8 = session->sftpInit_sent;
        goto LAB_0012204b;
      }
    }
    _libssh2_error(session,-0x22,"session not authenticated yet");
  }
  return (LIBSSH2_SFTP *)0x0;
switchD_00121f13_caseD_0:
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    __assert_fail("!session->sftpInit_sftp",
                  "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c",
                  0x324,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
  }
  session->sftpInit_state = libssh2_NB_state_created;
switchD_00121f13_caseD_2:
  pLVar6 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->sftpInit_channel = pLVar6;
  if (pLVar6 == (LIBSSH2_CHANNEL *)0x0) {
    iVar4 = libssh2_session_last_errno(session);
    if (iVar4 == -0x25) {
      pcVar10 = "Would block starting up channel";
      goto LAB_00122172;
    }
    _libssh2_error(session,-0x15,"Unable to startup channel");
LAB_0012219e:
    session->sftpInit_state = libssh2_NB_state_idle;
LAB_00122250:
    sftp = (LIBSSH2_SFTP *)0x0;
  }
  else {
    session->sftpInit_state = libssh2_NB_state_sent;
LAB_00121f73:
    iVar2 = _libssh2_channel_process_startup(pLVar6,"subsystem",9,"sftp",4);
    if (iVar2 != 0) {
      if (iVar2 != -0x25) {
        iVar4 = -0x15;
        pcVar10 = "Unable to request SFTP subsystem";
        goto LAB_00122241;
      }
      pcVar10 = "Would block to request SFTP subsystem";
LAB_00122172:
      _libssh2_error(session,-0x25,pcVar10);
      goto LAB_00122250;
    }
    session->sftpInit_state = libssh2_NB_state_sent1;
switchD_00121f13_caseD_4:
    iVar2 = _libssh2_channel_extended_data(session->sftpInit_channel,1);
    if (iVar2 == -0x25) {
      pcVar10 = "Would block requesting handle extended data";
      goto LAB_00122172;
    }
    sftp = (LIBSSH2_SFTP *)_libssh2_calloc(session,0x180);
    session->sftpInit_sftp = sftp;
    if (sftp == (LIBSSH2_SFTP *)0x0) {
      pcVar10 = "Unable to allocate a new SFTP structure";
      goto LAB_00122241;
    }
    sftp->channel = session->sftpInit_channel;
    sftp->request_id = 0;
    _libssh2_htonu32(buf_00,5);
    session->sftpInit_buffer[4] = '\x01';
    _libssh2_htonu32(session->sftpInit_buffer + 5,3);
    session->sftpInit_sent = 0;
    session->sftpInit_state = libssh2_NB_state_sent2;
    sVar8 = 0;
LAB_0012204b:
    sVar7 = _libssh2_channel_write(session->sftpInit_channel,0,buf_00 + sVar8,9 - sVar8);
    if (sVar7 == -0x25) {
      pcVar10 = "Would block sending SSH_FXP_INIT";
      goto LAB_00122172;
    }
    if (sVar7 < 0) {
      iVar4 = -7;
      pcVar10 = "Unable to send SSH_FXP_INIT";
LAB_00122241:
      _libssh2_error(session,iVar4,pcVar10);
LAB_00122246:
      session->sftpInit_state = libssh2_NB_state_error_closing;
      goto LAB_00122250;
    }
    sVar8 = sVar7 + session->sftpInit_sent;
    session->sftpInit_sent = sVar8;
    if (sVar8 == 9) {
      session->sftpInit_state = libssh2_NB_state_sent3;
    }
    else {
      lVar3 = session->sftpInit_state;
switchD_00121f13_caseD_1:
      if (lVar3 == libssh2_NB_state_error_closing) {
        iVar4 = _libssh2_channel_free(session->sftpInit_channel);
        if (iVar4 != -0x25) {
          session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
          if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
            (*session->free)(session->sftpInit_sftp,&session->abstract);
            session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
          }
          goto LAB_0012219e;
        }
        pcVar10 = "Would block closing channel";
        goto LAB_00122172;
      }
    }
    iVar4 = sftp_packet_require(sftp,'\x02',0,&data,&data_len,5);
    sVar8 = data_len;
    puVar1 = data;
    if (iVar4 == -0x26) {
      if (data_len != 0) {
        (*session->free)(data,&session->abstract);
      }
      iVar4 = -0x1f;
      pcVar10 = "Invalid SSH_FXP_VERSION response";
      goto LAB_00122241;
    }
    if (iVar4 != 0) {
      if (iVar4 == -0x25) {
        pcVar10 = "Would block receiving SSH_FXP_VERSION";
        goto LAB_00122172;
      }
      pcVar10 = "Timeout waiting for response from SFTP subsystem";
      goto LAB_00122241;
    }
    buf.data = data;
    buf.dataptr = data + 1;
    buf.len = data_len;
    out = &sftp->version;
    local_88 = ppLVar11;
    local_70 = buf_00;
    iVar4 = _libssh2_get_u32(&buf,out);
    if (iVar4 != 0) {
      (*session->free)(data,&session->abstract);
      _libssh2_error(session,-0x26,"Data too short when extracting version");
      buf_00 = local_70;
      ppLVar11 = local_88;
      goto LAB_00122246;
    }
    if (3 < *out) {
      *out = 3;
    }
    while (buf_00 = local_70, buf.dataptr < puVar1 + sVar8) {
      iVar4 = _libssh2_get_string(&buf,&extname,&extname_len);
      if (iVar4 != 0) {
        (*session->free)(data,&session->abstract);
        pcVar10 = "Data too short when extracting extname";
LAB_001223ee:
        _libssh2_error(session,-0x26,pcVar10);
        ppLVar11 = local_88;
        goto LAB_00122246;
      }
      iVar4 = _libssh2_get_string(&buf,&extdata,&local_80);
      if (iVar4 != 0) {
        (*session->free)(data,&session->abstract);
        pcVar10 = "Data too short when extracting extdata";
        goto LAB_001223ee;
      }
      if (local_80 == 0) {
        uVar5 = 0;
      }
      else {
        pcVar10 = (char *)(*session->alloc)(local_80 + 1,&session->abstract);
        if (pcVar10 == (char *)0x0) {
          _libssh2_error(session,-6,"Unable to allocate memory for SSH_FXP_VERSION packet");
          ppLVar11 = local_88;
          goto LAB_00122246;
        }
        memcpy(pcVar10,extdata,local_80);
        pcVar10[local_80] = '\0';
        lVar9 = strtol(pcVar10,(char **)0x0,10);
        uVar5 = (uint32_t)lVar9;
        (*session->free)(pcVar10,&session->abstract);
      }
      if ((extname_len == 0x18) &&
         (iVar4 = strncmp("posix-rename@openssh.com",(char *)extname,0x18), iVar4 == 0)) {
        sftp->posix_rename_version = uVar5;
      }
    }
    (*session->free)(data,&session->abstract);
    ppLVar11 = local_88;
    pLVar6 = sftp->channel;
    pLVar6->abstract = sftp;
    pLVar6->close_cb = libssh2_sftp_dtor;
    session->sftpInit_state = libssh2_NB_state_idle;
    *local_88 = (LIBSSH2_SFTP *)0x0;
    local_88[1] = (LIBSSH2_SFTP *)0x0;
    _libssh2_list_init(&sftp->sftp_handles);
  }
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    return sftp;
  }
  if (session->api_block_mode == 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = libssh2_session_last_errno(session);
  if (iVar4 != -0x25) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = _libssh2_wait_socket(session,start_time);
  if (iVar4 != 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  goto LAB_00121ee8;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}